

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embedded_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::EmbeddedGeometryInterface::computeFaceNormals
          (EmbeddedGeometryInterface *this)

{
  Vertex e;
  Vertex e_00;
  Vertex e_01;
  Face e_02;
  bool bVar1;
  Vector3 *pVVar2;
  ParentMeshT *in_RDI;
  Vector3 normal;
  Vector3 pC;
  Vector3 pB;
  Vector3 pA;
  Halfedge he;
  Halfedge heF;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *__range3;
  Vector3 normalSum;
  Face f;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::FaceRangeF> __begin2;
  FaceSet *__range2;
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3> *in_stack_fffffffffffffd78;
  SurfaceMesh *in_stack_fffffffffffffd80;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *in_stack_fffffffffffffd90;
  ParentMeshT *in_stack_fffffffffffffda0;
  ParentMeshT *in_stack_fffffffffffffda8;
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3> *in_stack_fffffffffffffdb0;
  double local_248;
  double local_240;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_238;
  Vector3 local_228;
  Vector3 local_210;
  Vector3 local_1f8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_1e0;
  Vector3 local_1d0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_1b8;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_1a8;
  Vector3 local_198;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_180;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_170;
  Vector3 local_160;
  ParentMeshT *local_148;
  size_t local_140;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_138;
  NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_128 [2];
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> local_f8;
  NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *local_d0;
  Vector3 local_c8;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_b0;
  undefined1 local_70 [24];
  undefined1 *local_58;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffd80);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::MeshData
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::operator=
            ((MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3> *)
             in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::~MeshData
            ((MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3> *)
             in_stack_fffffffffffffd80);
  SurfaceMesh::faces(in_stack_fffffffffffffd80);
  local_58 = local_70;
  RangeSetBase<geometrycentral::surface::FaceRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd80);
  RangeSetBase<geometrycentral::surface::FaceRangeF>::end
            ((RangeSetBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd80);
  do {
    bVar1 = RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffd80,
                       (RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)
                       in_stack_fffffffffffffd78);
    if (!bVar1) {
      return;
    }
    local_b0 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)0x2b9bdf);
    Vector3::zero();
    Face::adjacentHalfedges((Face *)in_stack_fffffffffffffd90);
    local_d0 = &local_f8;
    NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::begin
              ((NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
               in_stack_fffffffffffffd90);
    NavigationSetBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::end
              (local_128,local_d0);
    while (bVar1 = NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::
                   operator!=((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                               *)in_stack_fffffffffffffd80,
                              (NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                               *)in_stack_fffffffffffffd78), bVar1) {
      local_138 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                    ::operator*((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>
                                 *)0x2b9c76);
      local_148 = local_138.mesh;
      local_140 = local_138.ind;
      in_stack_fffffffffffffd80 =
           (SurfaceMesh *)
           &in_RDI[6].heVertInNextArr.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
      local_170 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::vertex((Halfedge *)in_stack_fffffffffffffd80);
      e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)in_stack_fffffffffffffda0;
      e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_RDI;
      pVVar2 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                         (in_stack_fffffffffffffd90,e);
      local_160.x = pVVar2->x;
      local_160.y = pVVar2->y;
      local_160.z = pVVar2->z;
      local_180 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )Halfedge::next((Halfedge *)in_stack_fffffffffffffd80);
      local_148 = local_180.mesh;
      local_140 = local_180.ind;
      local_1a8 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::vertex((Halfedge *)in_stack_fffffffffffffd80);
      e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffda0;
      e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_RDI;
      pVVar2 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                         (in_stack_fffffffffffffd90,e_00);
      local_198.x = pVVar2->x;
      local_198.y = pVVar2->y;
      local_198.z = pVVar2->z;
      local_1b8 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )Halfedge::next((Halfedge *)in_stack_fffffffffffffd80);
      local_148 = local_1b8.mesh;
      local_140 = local_1b8.ind;
      in_stack_fffffffffffffd90 =
           (MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *)
           &in_RDI[6].heVertInNextArr.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish;
      local_1e0 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::vertex((Halfedge *)in_stack_fffffffffffffd80);
      e_01.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffda0;
      e_01.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_RDI;
      pVVar2 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                         (in_stack_fffffffffffffd90,e_01);
      local_1d0.x = pVVar2->x;
      local_1d0.y = pVVar2->y;
      local_1d0.z = pVVar2->z;
      Vector3::operator-(&local_210,&local_198,&local_160);
      Vector3::operator-(&local_228,&local_1d0,&local_160);
      cross(&local_1f8,&local_210,&local_228);
      Vector3::operator+=(&local_c8,&local_1f8);
      local_238 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )Halfedge::next((Halfedge *)in_stack_fffffffffffffd80);
      bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
              operator==(&local_238,&local_138);
      if (bVar1) break;
      NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator>::operator++
                ((NavigationIteratorBase<geometrycentral::surface::FaceAdjacentHalfedgeNavigator> *)
                 in_stack_fffffffffffffd80);
    }
    unit((Vector3 *)in_stack_fffffffffffffd80);
    e_02.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)local_b0.mesh;
    e_02.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_RDI;
    in_stack_fffffffffffffda0 = local_b0.mesh;
    pVVar2 = MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3>::operator[]
                       ((MeshData<geometrycentral::surface::Face,_geometrycentral::Vector3> *)
                        in_stack_fffffffffffffd90,e_02);
    pVVar2->x = (double)in_stack_fffffffffffffdb0;
    pVVar2->y = local_248;
    pVVar2->z = local_240;
    RangeIteratorBase<geometrycentral::surface::FaceRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::FaceRangeF> *)in_stack_fffffffffffffd80)
    ;
  } while( true );
}

Assistant:

void EmbeddedGeometryInterface::computeFaceNormals() {
  vertexPositionsQ.ensureHave();

  faceNormals = FaceData<Vector3>(mesh);

  for (Face f : mesh.faces()) {

    // For general polygons, take the sum of the cross products at each corner
    Vector3 normalSum = Vector3::zero();
    for (Halfedge heF : f.adjacentHalfedges()) {

      // Gather vertex positions for next three vertices
      Halfedge he = heF;
      Vector3 pA = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pB = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pC = vertexPositions[he.vertex()];

      normalSum += cross(pB - pA, pC - pA);

      // In the special case of a triangle, there is no need to to repeat at all three corners; the result will be the
      // same
      if (he.next() == heF) break;
    }

    Vector3 normal = unit(normalSum);
    faceNormals[f] = normal;
  }
}